

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::DebugContext::RundownSourcesAndReparse
          (DebugContext *this,bool shouldPerformSourceRundown,bool shouldReparseFunctions)

{
  code *pcVar1;
  anon_class_48_6_e02ebfb0 map;
  anon_class_16_2_8eb7caf3_for_map map_00;
  HRESULT HVar2;
  bool bVar3;
  Recycler *alloc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  ArenaAllocator *allocator;
  undefined4 *puVar5;
  OutOfMemoryException anon_var_0;
  TrackAllocData local_a0;
  AutoNestedHandledExceptionType local_74;
  ThreadContext *pTStack_70;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ThreadContext *threadContext;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_60;
  HRESULT hr;
  FunctionStartToYieldRegister *yieldFunctions;
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  *utf8SourceInfoList;
  List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pFunctionsToRegister;
  TempArenaAllocatorObject *tempAllocator;
  undefined1 local_30 [8];
  AutoRestoreIsReparsingSource autoRestoreIsReparsingSource;
  bool shouldReparseFunctions_local;
  bool shouldPerformSourceRundown_local;
  DebugContext *this_local;
  
  autoRestoreIsReparsingSource._14_1_ = shouldReparseFunctions;
  autoRestoreIsReparsingSource._15_1_ = shouldPerformSourceRundown;
  RundownSourcesAndReparse(bool,bool)::AutoRestoreIsReparsingSource::AutoRestoreIsReparsingSource(Js
  ::DebugContext__bool_(local_30,this,shouldReparseFunctions);
  Output::Trace(DebuggerPhase,
                L"DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"
                ,this->scriptContext,(ulong)((byte)autoRestoreIsReparsingSource._15_1_ & 1),
                (ulong)((byte)autoRestoreIsReparsingSource._14_1_ & 1));
  pFunctionsToRegister =
       (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       0x0;
  utf8SourceInfoList =
       (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
        *)0x0;
  yieldFunctions = (FunctionStartToYieldRegister *)0x0;
  pBStack_60 = (FunctionStartToYieldRegister *)0x0;
  threadContext._4_4_ = 0;
  pTStack_70 = ScriptContext::GetThreadContext(this->scriptContext);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_74,ExceptionType_OutOfMemory);
  pFunctionsToRegister =
       (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       ThreadContext::GetTemporaryAllocator(pTStack_70,L"debuggerAlloc");
  alloc = ScriptContext::GetRecycler(this->scriptContext);
  yieldFunctions =
       (FunctionStartToYieldRegister *)
       JsUtil::
       List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
       ::New(alloc,4);
  pAVar4 = &TempArenaAllocatorWrapper<false>::GetAllocator
                      ((TempArenaAllocatorWrapper<false> *)pFunctionsToRegister)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a0,
             (type_info *)
             &JsUtil::
              BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
             ,0xd1);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_a0);
  this_00 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar4,0x3f67b0);
  allocator = TempArenaAllocatorWrapper<false>::GetAllocator
                        ((TempArenaAllocatorWrapper<false> *)pFunctionsToRegister);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,allocator,0);
  map_00.utf8SourceInfoList =
       (List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
        **)&yieldFunctions;
  map_00.this = this;
  pBStack_60 = this_00;
  MapUTF8SourceInfoUntil<Js::DebugContext::RundownSourcesAndReparse(bool,bool)::__0>(this,map_00);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_74);
  if (threadContext._4_4_ < 0) {
    if (threadContext._4_4_ != -0x7ff8fff2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0xdc,"(hr == ((HRESULT)0x8007000EL))","hr == E_OUTOFMEMORY");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    map.hr = (HRESULT *)((long)&threadContext + 4);
    map.this = this;
    map.shouldReparseFunctions = (bool *)&autoRestoreIsReparsingSource.field_0xe;
    map.shouldPerformSourceRundown = (bool *)&autoRestoreIsReparsingSource.field_0xf;
    map.pFunctionsToRegister =
         (List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          **)&utf8SourceInfoList;
    map.yieldFunctions = &stack0xffffffffffffffa0;
    JsUtil::
    List<Js::Utf8SourceInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,RecyclerPointerComparer>::
    MapUntil<Js::DebugContext::RundownSourcesAndReparse(bool,bool)::__1>
              ((List<Js::Utf8SourceInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,RecyclerPointerComparer>
                *)yieldFunctions,map);
    bVar3 = IsSelfOrScriptContextClosed(this);
    if (bVar3) {
      threadContext._4_4_ = -0x7fffbffb;
    }
    else if ((((autoRestoreIsReparsingSource._15_1_ & 1) != 0) &&
             (bVar3 = ScriptContext::HaveCalleeSources(this->scriptContext), bVar3)) &&
            (this->hostDebugContext != (HostDebugContext *)0x0)) {
      ScriptContext::MapCalleeSources<Js::DebugContext::RundownSourcesAndReparse(bool,bool)::__2>
                (this->scriptContext,(anon_class_8_1_8991fb9c)this);
    }
    ThreadContext::ReleaseTemporaryAllocator
              (pTStack_70,(TempArenaAllocatorObject *)pFunctionsToRegister);
  }
  HVar2 = threadContext._4_4_;
  RundownSourcesAndReparse::AutoRestoreIsReparsingSource::~AutoRestoreIsReparsingSource
            ((AutoRestoreIsReparsingSource *)local_30);
  return HVar2;
}

Assistant:

HRESULT DebugContext::RundownSourcesAndReparse(bool shouldPerformSourceRundown, bool shouldReparseFunctions)
    {
        struct AutoRestoreIsReparsingSource
        {
            AutoRestoreIsReparsingSource(DebugContext* debugContext, bool shouldReparseFunctions)
                : debugContext(debugContext)
                , shouldReparseFunctions(shouldReparseFunctions)
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = true;
                }
            }
            ~AutoRestoreIsReparsingSource()
            {
                if (this->shouldReparseFunctions)
                {
                    this->debugContext->isReparsingSource = false;
                }
            }

        private:
            DebugContext* debugContext;
            bool shouldReparseFunctions;
        } autoRestoreIsReparsingSource(this, shouldReparseFunctions);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, shouldPerformSourceRundown %d, shouldReparseFunctions %d\n"),
            this->scriptContext, shouldPerformSourceRundown, shouldReparseFunctions);

        Js::TempArenaAllocatorObject *tempAllocator = nullptr;
        JsUtil::List<Js::FunctionInfo *, Recycler>* pFunctionsToRegister = nullptr;
        JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>* utf8SourceInfoList = nullptr;
        typedef JsUtil::BaseDictionary<uint32, RegSlot, ArenaAllocator, PowerOf2SizePolicy> FunctionStartToYieldRegister;

        // This container ensures that for Generator/Async functions the yield register is same between non-debug to debug parse.
        // Each entry represent a function's start position (each function will have unique start position in a file) and that function yield register
        FunctionStartToYieldRegister *yieldFunctions = nullptr;

        HRESULT hr = S_OK;
        ThreadContext* threadContext = this->scriptContext->GetThreadContext();

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        tempAllocator = threadContext->GetTemporaryAllocator(_u("debuggerAlloc"));

        utf8SourceInfoList = JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer>::New(this->scriptContext->GetRecycler());
        yieldFunctions = Anew(tempAllocator->GetAllocator(), FunctionStartToYieldRegister, tempAllocator->GetAllocator());

        this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            WalkAndAddUtf8SourceInfo(sourceInfo, utf8SourceInfoList);
            return false;
        });
        END_TRANSLATE_OOM_TO_HRESULT(hr);

        if (FAILED(hr))
        {
            Assert(hr == E_OUTOFMEMORY);
            return hr;
        }

        utf8SourceInfoList->MapUntil([&](int index, Js::Utf8SourceInfo * sourceInfo) -> bool
        {
            if (this->IsSelfOrScriptContextClosed())
            {
                hr = E_FAIL;
                return true;
            }

            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::RundownSourcesAndReparse scriptContext 0x%p, sourceInfo 0x%p, HasDebugDocument %d\n"),
                this->scriptContext, sourceInfo, sourceInfo->HasDebugDocument());

            if (sourceInfo->GetIsLibraryCode())
            {
                // Not putting the internal library code to the debug mode, but need to reinitialize execution mode limits of each
                // function body upon debugger detach, even for library code at the moment.
                if (shouldReparseFunctions)
                {
                    sourceInfo->MapFunction([](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsFunctionParsed())
                        {
                            pFuncBody->ReinitializeExecutionModeAndLimits();
                        }
                        pFuncBody->UpdateEntryPointsOnDebugReparse();
                    });
                }

                return false;
            }

            Assert(sourceInfo->GetSrcInfo() && sourceInfo->GetSrcInfo()->sourceContextInfo);

#if DBG
            if (shouldPerformSourceRundown)
            {
                // We shouldn't have a debug document if we're running source rundown for the first time.
                Assert(!sourceInfo->HasDebugDocument());
            }
#endif // DBG

            DWORD_PTR dwDebugHostSourceContext = Js::Constants::NoHostSourceContext;

            if (shouldPerformSourceRundown && this->hostDebugContext != nullptr)
            {
                dwDebugHostSourceContext = this->hostDebugContext->GetHostSourceContext(sourceInfo);
            }

            pFunctionsToRegister = sourceInfo->GetTopLevelFunctionInfoList();

            if (pFunctionsToRegister == nullptr || pFunctionsToRegister->Count() == 0)
            {
                // This could happen if there are no functions to re-compile.
                return false;
            }

            if (this->hostDebugContext != nullptr && sourceInfo->GetSourceContextInfo())
            {
                // This call goes out of engine
                this->hostDebugContext->SetThreadDescription(sourceInfo->GetSourceContextInfo()->url); // the HRESULT is omitted.
            }

            if (shouldReparseFunctions)
            {
                yieldFunctions->Clear();
                BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                {
                    sourceInfo->MapFunction([&](Js::FunctionBody *const pFuncBody)
                    {
                        if (pFuncBody->IsCoroutine() && pFuncBody->GetYieldRegister() != Js::Constants::NoRegister)
                        {
                            yieldFunctions->Add(pFuncBody->StartInDocument(), pFuncBody->GetYieldRegister());
                        }
                    });
                }
                END_TRANSLATE_OOM_TO_HRESULT(hr);
                DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
            }

            bool fHasDoneSourceRundown = false;
            for (int i = 0; i < pFunctionsToRegister->Count(); i++)
            {
                if (this->IsSelfOrScriptContextClosed())
                {
                    hr = E_FAIL;
                    return true;
                }

                Js::FunctionInfo *functionInfo = pFunctionsToRegister->Item(i);
                if (functionInfo == nullptr)
                {
                    continue;
                }

                if (shouldReparseFunctions)
                {
                    BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(this->scriptContext, false)
                    {
                        functionInfo->GetParseableFunctionInfo()->Parse();
                        // This is the first call to the function, ensure dynamic profile info
#if ENABLE_PROFILE_INFO
                        functionInfo->GetFunctionBody()->EnsureDynamicProfileInfo();
#endif
                    }
                    END_JS_RUNTIME_CALL_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr);

                    // Debugger attach/detach failure is catastrophic, take down the process
                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);
                }

                // Parsing the function may change its FunctionProxy.
                Js::ParseableFunctionInfo *parseableFunctionInfo = functionInfo->GetParseableFunctionInfo();

                if (!fHasDoneSourceRundown && shouldPerformSourceRundown && !this->IsSelfOrScriptContextClosed())
                {
                    BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                    {
                        this->RegisterFunction(parseableFunctionInfo, dwDebugHostSourceContext, parseableFunctionInfo->GetSourceName());
                    }
                    END_TRANSLATE_OOM_TO_HRESULT(hr);

                    DEBUGGER_ATTACHDETACH_FATAL_ERROR_IF_FAILED(hr);

                    fHasDoneSourceRundown = true;
                }